

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall llbuild::ninja::Lexer::lexPathString(Lexer *this,Token *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Token *pTVar4;
  int c;
  Token *result_local;
  Lexer *this_local;
  
  while( true ) {
    while (iVar2 = peekNextChar(this), iVar2 == 0x24) {
      getNextChar(this);
      iVar2 = getNextChar(this);
      if (iVar2 == 10) {
        while( true ) {
          iVar2 = peekNextChar(this);
          bVar1 = isNonNewlineSpace(iVar2);
          if (!bVar1) break;
          getNextChar(this);
        }
      }
    }
    iVar3 = isspace(iVar2);
    if ((((iVar3 != 0) || (iVar2 == 0x3a)) || (iVar2 == 0x7c)) || (iVar2 == -1)) break;
    getNextChar(this);
  }
  pTVar4 = setTokenKind(this,result,String);
  return pTVar4;
}

Assistant:

Token &Lexer::lexPathString(Token &result) {
  // String tokens in path contexts consume until a space, ':', or '|'
  // character.
  while (true) {
    int c = peekNextChar();

    // If this is an escape character, skip the next character.
    if (c == '$') {
      getNextChar(); // Consume the actual '$'.

      // Consume the next character.
      c = getNextChar();

      // If the character was a newline, consume any leading spaces.
      if (c == '\n') {
        while (isNonNewlineSpace(peekNextChar()))
          getNextChar();
      }

      continue;
    }

    // Otherwise, continue only if this is not the EOL or EOF.
    if (isspace(c) || c == ':' || c == '|' || c == -1)
      break;

    getNextChar();
  }

  return setTokenKind(result, Token::Kind::String);
}